

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

char32_t QChar::toUpper(char32_t ucs4)

{
  char32_t in_EDI;
  char32_t unaff_retaddr;
  undefined4 local_4;
  
  local_4 = in_EDI;
  if ((uint)in_EDI < 0x110000) {
    local_4 = convertCase_helper<char32_t>(unaff_retaddr,ucs4);
  }
  return local_4;
}

Assistant:

char32_t QChar::toUpper(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return ucs4;
    return convertCase_helper(ucs4, QUnicodeTables::UpperCase);
}